

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int check_cert(X509_STORE_CTX *ctx)

{
  int iVar1;
  X509 *x_00;
  X509 *x;
  int cnum;
  int ok;
  X509_CRL *crl;
  X509_STORE_CTX *ctx_local;
  
  _cnum = (X509_CRL *)0x0;
  x._4_4_ = 0;
  crl = (X509_CRL *)ctx;
  x_00 = sk_X509_value(ctx->chain,(long)ctx->error_depth);
  *(X509 **)(crl->crl_hash + 0x1c) = x_00;
  crl[1].sig_alg = (X509_ALGOR *)0x0;
  *(undefined4 *)&crl[1].signature = 0;
  iVar1 = get_crl((X509_STORE_CTX *)crl,(X509_CRL **)&cnum,x_00);
  if (iVar1 == 0) {
    crl->crl_hash[0x18] = '\x03';
    crl->crl_hash[0x19] = '\0';
    crl->crl_hash[0x1a] = '\0';
    crl->crl_hash[0x1b] = '\0';
    x._4_4_ = call_verify_cb(0,(X509_STORE_CTX *)crl);
  }
  else {
    crl[1].crl = (X509_CRL_INFO *)_cnum;
    iVar1 = check_crl((X509_STORE_CTX *)crl,(X509_CRL *)_cnum);
    if ((iVar1 != 0) && (iVar1 = cert_crl((X509_STORE_CTX *)crl,(X509_CRL *)_cnum,x_00), iVar1 != 0)
       ) {
      x._4_4_ = 1;
    }
  }
  X509_CRL_free(_cnum);
  crl[1].crl = (X509_CRL_INFO *)0x0;
  return x._4_4_;
}

Assistant:

static int check_cert(X509_STORE_CTX *ctx) {
  X509_CRL *crl = NULL;
  int ok = 0, cnum = ctx->error_depth;
  X509 *x = sk_X509_value(ctx->chain, cnum);
  ctx->current_cert = x;
  ctx->current_crl_issuer = NULL;
  ctx->current_crl_score = 0;

  // Try to retrieve the relevant CRL. Note that |get_crl| sets
  // |current_crl_issuer| and |current_crl_score|, which |check_crl| then reads.
  //
  // TODO(davidben): The awkward internal calling convention is a historical
  // artifact of when these functions were user-overridable callbacks, even
  // though there was no way to set them correctly. These callbacks have since
  // been removed, so we can pass input and output parameters more directly.
  if (!get_crl(ctx, &crl, x)) {
    ctx->error = X509_V_ERR_UNABLE_TO_GET_CRL;
    ok = call_verify_cb(0, ctx);
    goto err;
  }

  ctx->current_crl = crl;
  if (!check_crl(ctx, crl) ||  //
      !cert_crl(ctx, crl, x)) {
    goto err;
  }

  ok = 1;

err:
  X509_CRL_free(crl);
  ctx->current_crl = NULL;
  return ok;
}